

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O3

json Ps2Tt(json *glyf,double errorBound)

{
  value_t vVar1;
  reference pbVar2;
  Segment s;
  Segment s_00;
  Segment s_01;
  undefined1 auVar3 [16];
  char cVar4;
  undefined7 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  reference pbVar8;
  iterator iVar9;
  Point PVar10;
  string_type *key;
  bool bVar11;
  reference pbVar12;
  reference pvVar13;
  size_t sVar14;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *piVar15;
  const_reference j;
  ulong uVar16;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value extraout_RDX_01;
  json_value extraout_RDX_02;
  json_value extraout_RDX_03;
  json_value jVar17;
  undefined8 in_RSI;
  _Base_ptr p_Var18;
  iterator __begin1_2;
  long lVar19;
  double *pdVar20;
  double dVar21;
  double dVar22;
  undefined4 uVar23;
  double dVar24;
  double dVar25;
  _Base_ptr p_Var26;
  double dVar27;
  double dVar28;
  json jVar29;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  const_iterator result;
  Solution inflections;
  const_iterator q;
  json quadContour;
  const_iterator beg;
  iterator __begin1_1;
  iterator __end1_1;
  anon_class_64_2_4710b9f6 advance;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __end1;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __begin1;
  allocator_type local_439;
  undefined1 local_438 [16];
  undefined1 auStack_428 [16];
  undefined1 local_418 [16];
  double local_408;
  double dStack_400;
  reference local_3f0;
  undefined1 local_3e8 [8];
  json_value local_3e0;
  double *local_3d8;
  iterator iStack_3d0;
  double *local_3c8;
  json *local_3b8;
  undefined1 local_3b0 [8];
  json_value local_3a8;
  double local_3a0;
  undefined1 local_398 [8];
  json_value local_390;
  double local_388;
  _Base_ptr p_Stack_380;
  Point local_378;
  double local_360;
  Point local_358;
  undefined1 local_348 [16];
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_338;
  undefined1 local_318 [16];
  _Base_ptr local_308;
  double dStack_300;
  _Base_ptr local_2f8;
  _Base_ptr p_Stack_2f0;
  _Base_ptr local_2e8;
  _Base_ptr p_Stack_2e0;
  string_type *local_2d8;
  double local_2d0;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_2c8;
  double local_2a8;
  double dStack_2a0;
  _Base_ptr local_298;
  _Base_ptr p_Stack_290;
  _Base_ptr local_288;
  _Base_ptr p_Stack_280;
  double local_278;
  double dStack_270;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_268;
  _Base_ptr local_248;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbStack_240;
  difference_type local_238;
  double local_228;
  double dStack_220;
  _Base_ptr local_218;
  _Base_ptr p_Stack_210;
  _Base_ptr local_208;
  _Base_ptr p_Stack_200;
  double local_1f8;
  _Base_ptr p_Stack_1f0;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1e8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1c8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1a8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_188;
  reference local_168;
  _Base_ptr local_160;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbStack_158;
  difference_type local_150;
  double local_148;
  double dStack_140;
  _Base_ptr local_138;
  _Base_ptr p_Stack_130;
  _Base_ptr local_128;
  _Base_ptr p_Stack_120;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_110;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_a0;
  
  glyf->m_type = null;
  (glyf->m_value).object = (object_t *)0x0;
  local_3a0 = errorBound;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(glyf);
  local_3b8 = glyf;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(glyf);
  local_110.anchor.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_110.anchor.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_110.anchor.m_it.primitive_iterator.m_it = -0x8000000000000000;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_begin(&local_110.anchor);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::iteration_proxy_value(&local_a0,&local_110.anchor);
  local_438[0] = (char)in_RSI;
  local_438._1_7_ = (undefined7)((ulong)in_RSI >> 8);
  local_438._8_8_ = (_Base_ptr)0x0;
  auStack_428 = ZEXT816(0x8000000000000000) << 0x40;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)local_438);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::iteration_proxy_value
            (&local_110,
             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)local_438);
  do {
    bVar11 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator==(&local_a0.anchor,&local_110.anchor);
    if (bVar11) {
      jVar17 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.empty_str._M_dataplus._M_p != &local_110.empty_str.field_2) {
        operator_delete(local_110.empty_str._M_dataplus._M_p,
                        local_110.empty_str.field_2._M_allocated_capacity + 1);
        jVar17 = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.array_index_str._M_dataplus._M_p != &local_110.array_index_str.field_2) {
        operator_delete(local_110.array_index_str._M_dataplus._M_p,
                        local_110.array_index_str.field_2._M_allocated_capacity + 1);
        jVar17 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.empty_str._M_dataplus._M_p != &local_a0.empty_str.field_2) {
        operator_delete(local_a0.empty_str._M_dataplus._M_p,
                        local_a0.empty_str.field_2._M_allocated_capacity + 1);
        jVar17 = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.array_index_str._M_dataplus._M_p != &local_a0.array_index_str.field_2) {
        operator_delete(local_a0.array_index_str._M_dataplus._M_p,
                        local_a0.array_index_str.field_2._M_allocated_capacity + 1);
        jVar17 = extraout_RDX_03;
      }
      jVar29.m_value.string = jVar17.string;
      jVar29._0_8_ = local_3b8;
      return jVar29;
    }
    local_2d8 = nlohmann::detail::
                iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                ::key(&local_a0);
    pbVar12 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&local_a0.anchor);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_3b0,pbVar12);
    auVar3 = auStack_428;
    local_438[0] = (char)auStack_428;
    cVar4 = local_438[0];
    local_438._1_7_ = (undefined7)((ulong)auStack_428 >> 8);
    uVar5 = local_438._1_7_;
    auStack_428._0_5_ = 0x4800000000;
    auStack_428._0_4_ = 0x6d657473;
    auVar7 = auStack_428;
    local_438._8_8_ = 5;
    auStack_428._6_10_ = auVar3._6_10_;
    auStack_428._0_5_ = auVar7._0_5_;
    auStack_428[5] = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_3b0,(key_type *)local_438);
    if ((undefined1 *)CONCAT71(local_438._1_7_,local_438[0]) != auStack_428) {
      operator_delete((undefined1 *)CONCAT71(local_438._1_7_,local_438[0]),auStack_428._0_8_ + 1);
    }
    auVar3 = auStack_428;
    auStack_428._0_5_ = 0x5600000000;
    auStack_428._0_4_ = 0x6d657473;
    auVar7 = auStack_428;
    local_438._8_8_ = 5;
    auStack_428._6_10_ = auVar3._6_10_;
    auStack_428._0_5_ = auVar7._0_5_;
    auStack_428[5] = 0;
    local_438[0] = cVar4;
    local_438._1_7_ = uVar5;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_3b0,(key_type *)local_438);
    if ((undefined1 *)CONCAT71(local_438._1_7_,local_438[0]) != auStack_428) {
      operator_delete((undefined1 *)CONCAT71(local_438._1_7_,local_438[0]),auStack_428._0_8_ + 1);
    }
    uVar6 = auStack_428._8_8_;
    auStack_428[8] = 0x73;
    auStack_428._0_8_ = 0x6b73614d746e6968;
    local_438._8_8_ = 9;
    auStack_428._10_6_ = SUB86(uVar6,2);
    auStack_428[9] = 0;
    local_438[0] = cVar4;
    local_438._1_7_ = uVar5;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_3b0,(key_type *)local_438);
    if ((undefined1 *)CONCAT71(local_438._1_7_,local_438[0]) != auStack_428) {
      operator_delete((undefined1 *)CONCAT71(local_438._1_7_,local_438[0]),auStack_428._0_8_ + 1);
    }
    uVar6 = auStack_428._8_8_;
    auStack_428._8_4_ = 0x736b7361;
    auStack_428._0_8_ = 0x4d72756f746e6f63;
    local_438._8_8_ = (_Base_ptr)0xc;
    auStack_428._13_3_ = SUB83(uVar6,5);
    auStack_428[0xc] = 0;
    local_438[0] = cVar4;
    local_438._1_7_ = uVar5;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_3b0,(key_type *)local_438);
    if ((undefined1 *)CONCAT71(local_438._1_7_,local_438[0]) != auStack_428) {
      operator_delete((undefined1 *)CONCAT71(local_438._1_7_,local_438[0]),auStack_428._0_8_ + 1);
    }
    pvVar13 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)local_3b0,"contours");
    local_268.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_268.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    local_268.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_268.m_object = pvVar13;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::set_begin(&local_268);
    local_1a8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_1a8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    local_1a8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_1a8.m_object = pvVar13;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::set_end(&local_1a8);
    bVar11 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator==(&local_268,&local_1a8);
    while (!bVar11) {
      local_3f0 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*(&local_268);
      if (local_3f0->m_type == object) {
        sVar14 = (((local_3f0->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
LAB_0011143f:
        if (1 < sVar14) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_318,(initializer_list_t)ZEXT816(0),false,array);
          pbVar8 = local_3f0;
          local_2c8.m_object = local_3f0;
          local_2c8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_2c8.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)0x0;
          local_2c8.m_it.primitive_iterator.m_it = -0x8000000000000000;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::set_begin(&local_2c8);
          local_438[0] = (char)pbVar8;
          local_438._1_7_ = (undefined7)((ulong)pbVar8 >> 8);
          local_438._8_8_ = (_Base_ptr)0x0;
          auStack_428 = ZEXT816(0x8000000000000000) << 0x40;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)local_438);
          piVar15 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator--((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)local_438);
          pbVar2 = piVar15->m_object;
          local_238 = (piVar15->m_it).primitive_iterator.m_it;
          local_248 = (piVar15->m_it).object_iterator._M_node;
          pbStack_240 = (piVar15->m_it).array_iterator._M_current;
          vVar1 = pbVar8->m_type;
          sVar14 = (size_t)vVar1;
          if (vVar1 != null) {
            if (vVar1 == object) {
              sVar14 = (((local_3f0->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                       _M_node_count;
            }
            else if (vVar1 == array) {
              sVar14 = (long)(((local_3f0->m_value).array)->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(((local_3f0->m_value).array)->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4;
            }
            else {
              sVar14 = 1;
            }
          }
          local_338.m_object = local_2c8.m_object;
          local_338.m_it.primitive_iterator.m_it = local_2c8.m_it.primitive_iterator.m_it;
          local_338.m_it.object_iterator._M_node = local_2c8.m_it.object_iterator._M_node;
          local_338.m_it.array_iterator._M_current = local_2c8.m_it.array_iterator._M_current;
          pbVar12 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator*(&local_338);
          Point::Point((Point *)local_438,pbVar12);
          local_378.x._1_7_ = local_438._1_7_;
          local_378.x._0_1_ = local_438[0];
          local_378.y = (double)local_438._8_8_;
          ConstructTtPath::Move((ConstructTtPath *)local_318,pbVar12,local_378);
          local_168 = pbVar2;
          local_188.m_object = local_2c8.m_object;
          local_188.m_it.primitive_iterator.m_it = local_2c8.m_it.primitive_iterator.m_it;
          local_188.m_it.object_iterator._M_node = local_2c8.m_it.object_iterator._M_node;
          local_188.m_it.array_iterator._M_current = local_2c8.m_it.array_iterator._M_current;
          local_150 = local_238;
          local_160 = local_248;
          pbStack_158 = pbStack_240;
          for (; sVar14 != 0; sVar14 = sVar14 + lVar19) {
            local_1c8.m_object = local_338.m_object;
            local_1c8.m_it.object_iterator._M_node = local_338.m_it.object_iterator._M_node;
            local_1c8.m_it.array_iterator._M_current = local_338.m_it.array_iterator._M_current;
            local_1c8.m_it.primitive_iterator.m_it = local_338.m_it.primitive_iterator.m_it;
            bVar11 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator==(&local_1c8,&local_188);
            if (bVar11) {
              local_438[0] = (char)local_168;
              local_438._1_7_ = (undefined7)((ulong)local_168 >> 8);
              local_438._8_8_ = local_160;
              auStack_428._8_8_ = local_150;
              auStack_428._0_8_ = pbStack_158;
              local_338.m_object = local_168;
            }
            else {
              local_438[0] = (char)local_1c8.m_object;
              local_438._1_7_ = (undefined7)((ulong)local_1c8.m_object >> 8);
              local_438._8_8_ = local_1c8.m_it.object_iterator._M_node;
              auStack_428._8_8_ = local_1c8.m_it.primitive_iterator.m_it;
              auStack_428._0_8_ = local_1c8.m_it.array_iterator._M_current;
              nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator+=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_438,-1);
              local_338.m_object = (pointer)CONCAT71(local_438._1_7_,local_438[0]);
            }
            local_338.m_it.primitive_iterator.m_it = auStack_428._8_8_;
            local_338.m_it.object_iterator._M_node = (_Base_ptr)local_438._8_8_;
            local_338.m_it.array_iterator._M_current =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)auStack_428._0_8_;
            pbVar12 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      ::operator*(&local_338);
            j = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)pbVar12,"on");
            nlohmann::detail::
            from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                      (j,(boolean_t *)local_438);
            if (local_438[0] == '\x01') {
              pbVar12 = nlohmann::detail::
                        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator*(&local_338);
              Point::Point((Point *)local_438,pbVar12);
              local_358.x._1_7_ = local_438._1_7_;
              local_358.x._0_1_ = local_438[0];
              local_358.y = (double)local_438._8_8_;
              lVar19 = -1;
              ConstructTtPath::Line((ConstructTtPath *)local_318,pbVar12,local_358);
            }
            else {
              pbVar12 = nlohmann::detail::
                        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator*(&local_338);
              Point::Point((Point *)local_438,pbVar12);
              local_128 = (_Base_ptr)CONCAT71(local_438._1_7_,local_438[0]);
              p_Stack_120 = (_Base_ptr)local_438._8_8_;
              nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator--(&local_338);
              pbVar12 = nlohmann::detail::
                        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator*(&local_338);
              Point::Point((Point *)local_438,pbVar12);
              local_138 = (_Base_ptr)CONCAT71(local_438._1_7_,local_438[0]);
              p_Stack_130 = (_Base_ptr)local_438._8_8_;
              local_1e8.m_object = local_338.m_object;
              local_1e8.m_it.primitive_iterator.m_it = local_338.m_it.primitive_iterator.m_it;
              local_1e8.m_it.object_iterator._M_node = local_338.m_it.object_iterator._M_node;
              local_1e8.m_it.array_iterator._M_current = local_338.m_it.array_iterator._M_current;
              bVar11 = nlohmann::detail::
                       iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator==(&local_1e8,&local_188);
              if (bVar11) {
                local_438[0] = (char)local_168;
                local_438._1_7_ = (undefined7)((ulong)local_168 >> 8);
                local_438._8_8_ = local_160;
                auStack_428._8_8_ = local_150;
                auStack_428._0_8_ = pbStack_158;
                local_338.m_object = local_168;
              }
              else {
                local_438[0] = (char)local_1e8.m_object;
                local_438._1_7_ = (undefined7)((ulong)local_1e8.m_object >> 8);
                local_438._8_8_ = local_1e8.m_it.object_iterator._M_node;
                auStack_428._8_8_ = local_1e8.m_it.primitive_iterator.m_it;
                auStack_428._0_8_ = local_1e8.m_it.array_iterator._M_current;
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator+=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)local_438,-1);
                local_338.m_object = (pointer)CONCAT71(local_438._1_7_,local_438[0]);
              }
              local_338.m_it.primitive_iterator.m_it = auStack_428._8_8_;
              local_338.m_it.object_iterator._M_node = (_Base_ptr)local_438._8_8_;
              local_338.m_it.array_iterator._M_current =
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)auStack_428._0_8_;
              pbVar12 = nlohmann::detail::
                        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator*(&local_338);
              Point::Point((Point *)local_438,pbVar12);
              local_1f8 = (double)CONCAT71(local_438._1_7_,local_438[0]);
              local_218 = local_128;
              p_Stack_210 = p_Stack_120;
              local_208 = local_138;
              p_Stack_200 = p_Stack_130;
              local_228 = local_378.x;
              dStack_220 = local_378.y;
              p_Stack_1f0 = (_Base_ptr)local_438._8_8_;
              dVar24 = (double)p_Stack_130 * -3.0;
              dVar28 = ((((double)p_Stack_120 - ((double)p_Stack_130 + (double)p_Stack_130)) +
                        (double)local_438._8_8_) * local_378.x +
                       (((double)p_Stack_120 * -3.0 + local_378.y + local_378.y +
                        (double)local_438._8_8_) * (double)local_138 -
                       ((local_378.y - ((double)p_Stack_120 + (double)p_Stack_120)) +
                       (double)p_Stack_130) * local_1f8)) -
                       ((double)local_438._8_8_ + (double)local_438._8_8_ + dVar24 + local_378.y) *
                       (double)local_128;
              local_358.y = (double)local_438._8_8_;
              local_358.x = local_1f8;
              dVar27 = ((local_378.y + local_378.y + dVar24 + (double)local_438._8_8_) *
                        (double)local_128 +
                       local_1f8 * (local_378.y - (double)p_Stack_120) +
                       ((double)p_Stack_120 - local_378.y) * (double)local_138 * 3.0) -
                       (dVar24 + (double)p_Stack_120 + (double)p_Stack_120 + (double)local_438._8_8_
                       ) * local_378.x;
              local_2e8 = p_Stack_120;
              p_Stack_2e0 = local_138;
              local_2f8 = p_Stack_130;
              p_Stack_2f0 = (_Base_ptr)0x0;
              local_308 = local_128;
              dStack_300 = 0.0;
              dVar24 = ((double)p_Stack_130 - local_378.y) * (double)local_128 +
                       (local_378.y - (double)p_Stack_120) * (double)local_138 +
                       ((double)p_Stack_120 - (double)p_Stack_130) * local_378.x;
              if ((dVar28 != 0.0) || (NAN(dVar28))) {
                dVar24 = dVar27 * dVar27 + dVar24 * dVar28 * -4.0;
                if (dVar24 <= 0.0) {
                  if ((dVar24 == 0.0) && (!NAN(dVar24))) goto LAB_00111b73;
                  local_360 = -dVar27 / (dVar28 + dVar28);
                  __l_01._M_len = 1;
                  __l_01._M_array = &local_360;
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)local_438,__l_01,
                             (allocator_type *)&local_2a8);
                }
                else {
                  dVar21 = SQRT(dVar24);
                  local_348._8_8_ = local_378.y;
                  local_348._0_8_ = dVar27;
                  p_Var18 = local_138;
                  dVar22 = dVar21;
                  if (dVar24 < 0.0) {
                    p_Stack_380 = local_138;
                    dStack_140 = local_378.y;
                    local_388 = dVar28;
                    local_2d0 = dVar21;
                    local_148 = dVar24;
                    dVar21 = sqrt(dVar24);
                    dVar24 = local_148;
                    dVar27 = (double)local_348._0_8_;
                    dVar28 = local_388;
                    p_Var18 = p_Stack_380;
                    dVar22 = local_2d0;
                  }
                  dVar28 = dVar28 + dVar28;
                  local_2a8 = (-dVar27 - dVar21) / dVar28;
                  if (dVar24 < 0.0) {
                    local_388 = dVar28;
                    p_Stack_380 = p_Var18;
                    dVar22 = sqrt(dVar24);
                    dVar27 = (double)local_348._0_8_;
                    dVar28 = local_388;
                  }
                  dStack_2a0 = (dVar22 - dVar27) / dVar28;
                  __l._M_len = 2;
                  __l._M_array = &local_2a8;
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)local_438,__l,&local_439);
                }
              }
              else if ((dVar27 != 0.0) || (NAN(dVar27))) {
                local_2a8 = -dVar24 / dVar27;
                __l_00._M_len = 1;
                __l_00._M_array = &local_2a8;
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)local_438,__l_00,
                           (allocator_type *)&local_360);
              }
              else {
LAB_00111b73:
                local_438[0] = '\0';
                local_438._1_7_ = 0;
                local_438._8_8_ = (_Base_ptr)0x0;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = auStack_428._8_8_;
                auStack_428 = auVar3 << 0x40;
              }
              uVar6 = local_438._8_8_;
              local_3d8 = (double *)0x0;
              iStack_3d0._M_current = (double *)0x0;
              local_3c8 = (double *)0x0;
              p_Var18 = (_Base_ptr)CONCAT71(local_438._1_7_,local_438[0]);
              if (p_Var18 != (_Base_ptr)local_438._8_8_) {
                do {
                  dVar24 = *(double *)p_Var18;
                  if ((1e-06 < dVar24) && (dVar24 < 0.999999)) {
                    if (iStack_3d0._M_current == local_3c8) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)&local_3d8,iStack_3d0,
                                 (double *)p_Var18);
                    }
                    else {
                      *iStack_3d0._M_current = dVar24;
                      iStack_3d0._M_current = iStack_3d0._M_current + 1;
                    }
                  }
                  iVar9._M_current = iStack_3d0._M_current;
                  pdVar20 = local_3d8;
                  p_Var18 = (_Base_ptr)&p_Var18->_M_parent;
                } while (p_Var18 != (_Base_ptr)uVar6);
                if (local_3d8 != iStack_3d0._M_current) {
                  uVar16 = (long)iStack_3d0._M_current - (long)local_3d8 >> 3;
                  lVar19 = 0x3f;
                  if (uVar16 != 0) {
                    for (; uVar16 >> lVar19 == 0; lVar19 = lVar19 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (local_3d8,iStack_3d0._M_current,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (pdVar20,iVar9._M_current);
                }
                p_Var18 = (_Base_ptr)CONCAT71(local_438._1_7_,local_438[0]);
              }
              if (p_Var18 != (_Base_ptr)0x0) {
                operator_delete(p_Var18,auStack_428._0_8_ - (long)p_Var18);
              }
              iVar9._M_current = iStack_3d0._M_current;
              if (iStack_3d0._M_current == local_3d8) {
                s_01._M_elems[0].y = dStack_220;
                s_01._M_elems[0].x = local_228;
                s_01._M_elems[1].x = (double)local_218;
                s_01._M_elems[1].y = (double)p_Stack_210;
                s_01._M_elems[2].x = (double)local_208;
                s_01._M_elems[2].y = (double)p_Stack_200;
                s_01._M_elems[3].x = local_1f8;
                s_01._M_elems[3].y = (double)p_Stack_1f0;
                ApproximateSimpleSegment
                          (s_01,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                 *)local_318,local_3a0);
              }
              else {
                pdVar20 = local_3d8;
                p_Var18 = (_Base_ptr)0x0;
                p_Stack_380 = local_2e8;
                p_Var26 = p_Stack_2e0;
                local_348._0_8_ = local_308;
                p_Stack_2f0 = local_2f8;
                do {
                  PVar10 = local_378;
                  local_2e8 = (_Base_ptr)*pdVar20;
                  dVar28 = 1.0 - (1.0 - (double)local_2e8) / (1.0 - (double)p_Var18);
                  local_438[0] = local_378.x._0_1_;
                  local_438._1_7_ = local_378.x._1_7_;
                  local_438._8_8_ = local_378.y;
                  dVar25 = 1.0 - dVar28;
                  dVar21 = (double)local_348._0_8_ * dVar25 + (double)p_Var26 * dVar28;
                  dVar22 = (double)p_Stack_2f0 * dVar28 + (double)p_Stack_380 * dVar25;
                  local_308 = (_Base_ptr)(local_358.x * dVar28 + (double)p_Var26 * dVar25);
                  dStack_300 = local_378.y * dVar25 + (double)p_Stack_380 * dVar28;
                  local_2f8 = (_Base_ptr)(local_378.x * dVar25 + (double)local_348._0_8_ * dVar28);
                  p_Stack_2f0 = (_Base_ptr)(local_358.y * dVar28 + (double)p_Stack_2f0 * dVar25);
                  dVar24 = dVar28 * (double)local_308 + dVar25 * dVar21;
                  dVar27 = dVar25 * dStack_300 + dVar28 * dVar22;
                  uVar23 = (undefined4)((ulong)dVar27 >> 0x20);
                  local_388 = dVar25 * (double)local_2f8 + dVar21 * dVar28;
                  p_Stack_380 = (_Base_ptr)(dVar28 * (double)p_Stack_2f0 + dVar22 * dVar25);
                  local_408 = dVar25 * local_388 + dVar28 * dVar24;
                  dStack_400 = dVar28 * (double)p_Stack_380 + dVar25 * dVar27;
                  auStack_428._8_4_ = SUB84(dStack_300,0);
                  auStack_428._0_8_ = local_2f8;
                  auStack_428._12_4_ = (int)((ulong)dStack_300 >> 0x20);
                  local_348._8_4_ = SUB84(dVar27,0);
                  local_348._0_8_ = dVar24;
                  local_348._12_4_ = uVar23;
                  local_418._8_4_ = SUB84(dVar27,0);
                  local_418._0_8_ = local_388;
                  local_418._12_4_ = uVar23;
                  local_378.y = dStack_400;
                  local_378.x = local_408;
                  s._M_elems[1].x = (double)local_2f8;
                  s._M_elems[0] = PVar10;
                  s._M_elems[1].y = (double)auStack_428._8_8_;
                  s._M_elems[2].x = local_388;
                  s._M_elems[2].y = (double)local_418._8_8_;
                  s._M_elems[3].x = local_408;
                  s._M_elems[3].y = dStack_400;
                  ApproximateSimpleSegment
                            (s,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_318,local_3a0);
                  pdVar20 = pdVar20 + 1;
                  p_Var18 = local_2e8;
                  p_Var26 = local_308;
                } while (pdVar20 != iVar9._M_current);
                local_2a8 = local_378.x;
                dStack_2a0 = local_378.y;
                local_298 = (_Base_ptr)local_348._0_8_;
                p_Stack_290 = p_Stack_380;
                local_288 = local_308;
                p_Stack_280 = p_Stack_2f0;
                local_278 = local_358.x;
                dStack_270 = local_358.y;
                s_00._M_elems[1].x = (double)local_348._0_8_;
                s_00._M_elems[0] = local_378;
                s_00._M_elems[1].y = (double)p_Stack_380;
                s_00._M_elems[2].x = (double)local_308;
                s_00._M_elems[2].y = (double)p_Stack_2f0;
                s_00._M_elems[3].x = local_358.x;
                s_00._M_elems[3].y = local_358.y;
                ApproximateSimpleSegment
                          (s_00,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                 *)local_318,local_3a0);
              }
              if (local_3d8 != (double *)0x0) {
                operator_delete(local_3d8,(long)local_3c8 - (long)local_3d8);
              }
              lVar19 = -3;
            }
            local_378 = local_358;
          }
          ConstructTtPath::Finish
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_318);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_398,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_318);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_398);
          vVar1 = local_3f0->m_type;
          local_3f0->m_type = local_398[0];
          jVar17 = local_3f0->m_value;
          local_3f0->m_value = local_390;
          local_398[0] = vVar1;
          local_390 = jVar17;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(local_3f0);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_398);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_398 + 8),local_398[0]);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_318);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_318 + 8),local_318[0]);
        }
      }
      else if (local_3f0->m_type == array) {
        sVar14 = (long)(((local_3f0->m_value).array)->
                       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(((local_3f0->m_value).array)->
                       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 4;
        goto LAB_0011143f;
      }
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_268);
      bVar11 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator==(&local_268,&local_1a8);
    }
    local_3e8[0] = local_3b0[0];
    local_3e0 = local_3a8;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_3b0);
    local_3b0[0] = null;
    local_3a8.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_3e8);
    key = local_2d8;
    pvVar13 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](local_3b8,local_2d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_3e8);
    vVar1 = pvVar13->m_type;
    pvVar13->m_type = local_3e8[0];
    jVar17 = pvVar13->m_value;
    pvVar13->m_value = local_3e0;
    local_3e8[0] = vVar1;
    local_3e0 = jVar17;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(pvVar13);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_3e8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_3e8 + 8),local_3e8[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_3b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_3b0 + 8),local_3b0[0]);
    pvVar13 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](local_3b8,key);
    RoundInPlace(pvVar13);
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(&local_a0.anchor);
    local_a0.array_index = local_a0.array_index + 1;
  } while( true );
}

Assistant:

json Ps2Tt(const json &glyf, double errorBound)
{
	json glyfQuad;
	for (const auto &[name, glyph] : glyf.items())
	{
		glyfQuad[name] = Convert(glyph, errorBound);
		RoundInPlace(glyfQuad[name]);
	}
	return glyfQuad;
}